

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

int cmIsOn(void *arg,char *name)

{
  bool bVar1;
  allocator<char> local_41;
  string local_40;
  void *local_20;
  cmMakefile *mf;
  char *name_local;
  void *arg_local;
  
  local_20 = arg;
  mf = (cmMakefile *)name;
  name_local = (char *)arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,name,&local_41);
  bVar1 = cmMakefile::IsOn((cmMakefile *)arg,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return (uint)bVar1;
}

Assistant:

static int CCONV cmIsOn(void* arg, const char* name)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  return static_cast<int>(mf->IsOn(name));
}